

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engine.c
# Opt level: O1

void engine(qcc_context *_ctx)

{
  qcc_arena *arena;
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  qcc_engine engine;
  
  arena = qcc_rand_arena(_ctx);
  sVar1 = qcc_arena_memory_available(arena);
  qcc_context_register_param(_ctx,"%s: qcc_arena %zu bytes","arena",sVar1);
  qcc_engine_init(&engine,arena);
  uVar4 = (ulong)engine.total_tests;
  if (uVar4 == 0) {
    uVar4 = (ulong)engine.failed_tests;
    if (uVar4 == 0) {
      qcc_engine_run_test(&engine,"test_success",test_success);
      uVar4 = (ulong)engine.total_tests;
      if (uVar4 == 1) {
        uVar4 = (ulong)engine.failed_tests;
        if (uVar4 != 0) {
          pcVar2 = "engine.failed_tests";
          uVar6 = 0x17;
          goto LAB_001023c6;
        }
        qcc_engine_run_test(&engine,"test_failure",test_failure);
        uVar4 = (ulong)engine.total_tests;
        if (uVar4 != 2) {
          pcVar2 = "engine.total_tests";
          pcVar3 = "2";
          uVar6 = 0x1a;
          uVar5 = 2;
          goto LAB_001023cc;
        }
        uVar4 = (ulong)engine.failed_tests;
        if (uVar4 == 1) {
          return;
        }
        pcVar2 = "engine.failed_tests";
        uVar6 = 0x1b;
      }
      else {
        pcVar2 = "engine.total_tests";
        uVar6 = 0x16;
      }
      pcVar3 = "1";
      uVar5 = 1;
      goto LAB_001023cc;
    }
    pcVar2 = "engine.failed_tests";
    uVar6 = 0x13;
  }
  else {
    pcVar2 = "engine.total_tests";
    uVar6 = 0x12;
  }
LAB_001023c6:
  pcVar3 = "0";
  uVar5 = 0;
LAB_001023cc:
  qcc_context_fail(_ctx,"Assertion \"%s %s %s\" (%lu %s %lu) failed in %s (%s, line %d)\n",pcVar2,
                   "==",pcVar3,uVar4,"==",uVar5,"engine",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/skhoroshavin[P]qcc/test/test_engine.c"
                   ,uVar6);
  return;
}

Assistant:

TEST(engine)
{
    GIVEN_ARENA(arena);

    struct qcc_engine engine;
    qcc_engine_init(&engine, arena);
    ASSERT_UNSIGNED(engine.total_tests, ==, 0);
    ASSERT_UNSIGNED(engine.failed_tests, ==, 0);

    qcc_engine_run_test(&engine, "test_success", &test_success);
    ASSERT_UNSIGNED(engine.total_tests, ==, 1);
    ASSERT_UNSIGNED(engine.failed_tests, ==, 0);

    qcc_engine_run_test(&engine, "test_failure", &test_failure);
    ASSERT_UNSIGNED(engine.total_tests, ==, 2);
    ASSERT_UNSIGNED(engine.failed_tests, ==, 1);
}